

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O0

void __thiscall
gmlc::concurrency::DelayedDestructor<helics::Broker>::addObjectsToBeDestroyed
          (DelayedDestructor<helics::Broker> *this,shared_ptr<helics::Broker> *obj)

{
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> *in_RSI
  ;
  mutex_type *in_RDI;
  lock_guard<std::timed_mutex> lock;
  
  std::lock_guard<std::timed_mutex>::lock_guard((lock_guard<std::timed_mutex> *)in_RSI,in_RDI);
  std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
  push_back(in_RSI,(value_type *)in_RDI);
  std::lock_guard<std::timed_mutex>::~lock_guard((lock_guard<std::timed_mutex> *)0x50b994);
  return;
}

Assistant:

void addObjectsToBeDestroyed(std::shared_ptr<X> obj)
    {
        std::lock_guard<std::timed_mutex> lock(destructionLock);
        ElementsToBeDestroyed.push_back(std::move(obj));
    }